

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodel.h
# Opt level: O0

Value * Value::string(Value *__return_storage_ptr__,string *sval)

{
  string *sval_local;
  Value *v;
  
  Value(__return_storage_ptr__);
  __return_storage_ptr__->type = 2;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)sval);
  return __return_storage_ptr__;
}

Assistant:

static Value string(const std::string &sval) {
        Value v;
        v.type = StringValue;
        v.stringValue = sval;
        return v;
    }